

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationTOIDecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall
SimulationTOIDecPOMDPDiscrete::Step
          (SimulationTOIDecPOMDPDiscrete *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *aIs,uint t,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sIs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *oIs,double *r,double *sumR,
          double specialR)

{
  TOIDecPOMDPDiscrete *pTVar1;
  DecPOMDPDiscreteInterface *pDVar2;
  PlanningUnitTOIDecPOMDPDiscrete *pPVar3;
  MultiAgentDecisionProcessDiscreteInterface *pMVar4;
  pointer puVar5;
  undefined1 auVar6 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *aIs_00;
  int iVar7;
  undefined4 uVar8;
  State *pSVar9;
  ostream *poVar10;
  long *plVar11;
  pointer puVar12;
  double dVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> sIs_suc;
  stringstream ss;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_408;
  long *local_3f0;
  long local_3e8;
  long local_3e0 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_3d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_3c8;
  long *local_3c0;
  long local_3b8;
  long local_3b0 [2];
  long *local_3a0;
  long local_398;
  long local_390 [2];
  long *local_380;
  long local_378;
  long local_370 [2];
  long *local_360;
  long local_358;
  long local_350 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_340 [5];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  TransitionObservationIndependentMADPDiscrete::SampleSuccessorState
            (&local_408,
             &this->_m_puTOI->_m_TOIDecPOMDPDiscrete->
              super_TransitionObservationIndependentMADPDiscrete,sIs,aIs);
  TransitionObservationIndependentMADPDiscrete::SampleJointObservation
            (local_340,
             &this->_m_puTOI->_m_TOIDecPOMDPDiscrete->
              super_TransitionObservationIndependentMADPDiscrete,aIs,&local_408);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(oIs,local_340);
  if (local_340[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_340[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_340[0].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_340[0].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pTVar1 = this->_m_puTOI->_m_TOIDecPOMDPDiscrete;
  dVar13 = (double)(**(code **)(*(long *)&(pTVar1->
                                          super_TransitionObservationIndependentMADPDiscrete).
                                          super_MultiAgentDecisionProcess + 0x170))(pTVar1,sIs,aIs);
  *r = dVar13 + specialR;
  pDVar2 = (this->_m_puTOI->super_PlanningUnitDecPOMDPDiscrete)._m_DecPOMDP;
  auVar16 = (**(code **)(*(long *)((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb0)) +
                        0x70))((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb0));
  auVar15._0_8_ = auVar16._8_8_;
  auVar15._8_56_ = extraout_var_00;
  auVar6 = vcvtusi2sd_avx512f(auVar15._0_16_,t);
  auVar14._0_8_ = pow(auVar16._0_8_,auVar6._0_8_);
  auVar14._8_56_ = extraout_var;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar13 + specialR;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *sumR;
  auVar6 = vfmadd213sd_fma(auVar14._0_16_,auVar16,auVar6);
  *sumR = auVar6._0_8_;
  if ((this->super_SimulationDecPOMDPDiscrete).super_Simulation._m_verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Simulation::RunSimulation ",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
    pSVar9 = TransitionObservationIndependentMADPDiscrete::GetState
                       (&this->_m_puTOI->_m_TOIDecPOMDPDiscrete->
                         super_TransitionObservationIndependentMADPDiscrete,sIs);
    (*(pSVar9->super_NamedDescribedEntity)._vptr_NamedDescribedEntity[3])(&local_360,pSVar9);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_360,local_358);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
    pPVar3 = this->_m_puTOI;
    iVar7 = (*(pPVar3->super_PlanningUnitDecPOMDPDiscrete).super_PlanningUnitMADPDiscrete.
              super_PlanningUnit._vptr_PlanningUnit[9])(pPVar3,aIs);
    pMVar4 = (pPVar3->super_PlanningUnitDecPOMDPDiscrete).super_PlanningUnitMADPDiscrete._m_madp;
    plVar11 = (long *)(**(code **)((long)*pMVar4 + 0x80))(pMVar4,iVar7);
    (**(code **)(*plVar11 + 0x20))(&local_380,plVar11);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)local_380,local_378);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
    pSVar9 = TransitionObservationIndependentMADPDiscrete::GetState
                       (&this->_m_puTOI->_m_TOIDecPOMDPDiscrete->
                         super_TransitionObservationIndependentMADPDiscrete,&local_408);
    (*(pSVar9->super_NamedDescribedEntity)._vptr_NamedDescribedEntity[3])(&local_3a0,pSVar9);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)local_3a0,local_398);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,") (p ",5);
    dVar13 = TransitionObservationIndependentMADPDiscrete::GetTransitionProbability
                       (&this->_m_puTOI->_m_TOIDecPOMDPDiscrete->
                         super_TransitionObservationIndependentMADPDiscrete,sIs,aIs,&local_408);
    poVar10 = std::ostream::_M_insert<double>(dVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,") jo ",5);
    local_3d0 = aIs;
    local_3c8 = sIs;
    std::__cxx11::stringstream::stringstream(local_1b8);
    puVar12 = (oIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar5 = (oIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"< ",2);
    if (puVar12 != puVar5) {
      do {
        if (puVar12 !=
            (oIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_340);
        std::ostream::_M_insert<unsigned_long>
                  ((ulong)&local_340[0].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
        std::ios_base::~ios_base(local_2c0);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_3f0,local_3e8);
        if (local_3f0 != local_3e0) {
          operator_delete(local_3f0,local_3e0[0] + 1);
        }
        puVar12 = puVar12 + 1;
      } while (puVar12 != puVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," >",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)local_3c0,local_3b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    pPVar3 = this->_m_puTOI;
    pMVar4 = (pPVar3->super_PlanningUnitDecPOMDPDiscrete).super_PlanningUnitMADPDiscrete._m_madp;
    uVar8 = (**(code **)((long)*pMVar4 + 0xe0))(pMVar4,oIs);
    sIs = local_3c8;
    aIs_00 = local_3d0;
    pMVar4 = (pPVar3->super_PlanningUnitDecPOMDPDiscrete).super_PlanningUnitMADPDiscrete._m_madp;
    plVar11 = (long *)(**(code **)((long)*pMVar4 + 0xd8))(pMVar4,uVar8);
    (**(code **)(*plVar11 + 0x20))(local_340,plVar11);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)local_340[0].
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start,
                         (long)local_340[0].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (p ",4);
    dVar13 = TransitionObservationIndependentMADPDiscrete::GetObservationProbability
                       (&this->_m_puTOI->_m_TOIDecPOMDPDiscrete->
                         super_TransitionObservationIndependentMADPDiscrete,aIs_00,&local_408,oIs);
    poVar10 = std::ostream::_M_insert<double>(dVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,") r ",4);
    poVar10 = std::ostream::_M_insert<double>(*r);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," sumR ",6);
    poVar10 = std::ostream::_M_insert<double>(*sumR);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((pointer *)
        local_340[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        &local_340[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_340[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_340[0].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
    if (local_3c0 != local_3b0) {
      operator_delete(local_3c0,local_3b0[0] + 1);
    }
    if (local_3a0 != local_390) {
      operator_delete(local_3a0,local_390[0] + 1);
    }
    if (local_380 != local_370) {
      operator_delete(local_380,local_370[0] + 1);
    }
    if (local_360 != local_350) {
      operator_delete(local_360,local_350[0] + 1);
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(sIs,&local_408);
  if (local_408.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SimulationTOIDecPOMDPDiscrete::Step(const std::vector<Index> &aIs, 
                                         unsigned int t,
                                         std::vector<Index> &sIs, 
                                         std::vector<Index> &oIs,
                                         double &r,
                                         double &sumR,
                                         double specialR) const
{
    vector<Index> sIs_suc=_m_puTOI->GetReferred()->
        SampleSuccessorState(sIs,aIs);

    oIs=_m_puTOI->GetReferred()->SampleJointObservation(aIs,sIs_suc);
    r = _m_puTOI->GetReferred()->GetReward(sIs,aIs) + specialR;

    // calc. the discounted reward
    sumR+=r*pow(_m_puTOI->GetDiscount(),static_cast<double>(t));
    
    if(GetVerbose())
        cout << "Simulation::RunSimulation "
#if 0
             << "("
             << SoftPrintVector(sIs) << "," 
             << SoftPrintVector(aIs) << ","
             << SoftPrintVector(sIs_suc) << ") "
#endif
             << "("
             << (_m_puTOI->GetReferred()->GetState(sIs)->SoftPrintBrief())
             << ","
             << (_m_puTOI->GetJointAction(
                     _m_puTOI->IndividualToJointActionIndices(aIs)))
            ->SoftPrintBrief()
             << ","
             << (_m_puTOI->GetReferred()->GetState(sIs_suc)->SoftPrintBrief())
             << ") (p " 
             << _m_puTOI->GetReferred()->
            GetTransitionProbability(sIs,aIs,sIs_suc)
             << ") jo " << SoftPrintVector(oIs) << " "
             << (_m_puTOI->GetJointObservation(
                     _m_puTOI->IndividualToJointObservationIndices(oIs)))
            ->SoftPrintBrief()
             << " (p " 
             << _m_puTOI->GetReferred()->
            GetObservationProbability(aIs,sIs_suc,oIs)
             << ") r " << r << " sumR " << sumR << endl;

    sIs = sIs_suc;
}